

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void DeserializeHDKeypaths<DataStream>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths)

{
  pointer puVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  pend;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  KeyOriginInfo keypath;
  CPubKey pubkey;
  KeyOriginInfo local_88;
  CPubKey local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pend._M_current =
       (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar3 = (long)pend._M_current - (long)puVar1;
  if ((lVar3 == 0x22) || (lVar3 == 0x42)) {
    CPubKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_68,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar1 + 1),pend);
    bVar2 = CPubKey::IsFullyValid(&local_68);
    if (bVar2) {
      cVar4 = std::
              _Rb_tree<CPubKey,_std::pair<const_CPubKey,_KeyOriginInfo>,_std::_Select1st<std::pair<const_CPubKey,_KeyOriginInfo>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              ::find(&hd_keypaths->_M_t,&local_68);
      if ((_Rb_tree_header *)cVar4._M_node == &(hd_keypaths->_M_t)._M_impl.super__Rb_tree_header) {
        local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        DeserializeHDKeypath<DataStream>(s,&local_88);
        std::
        _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
        ::_M_emplace_unique<CPubKey&,KeyOriginInfo>
                  ((_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
                    *)hd_keypaths,&local_68,&local_88);
        if (local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.path.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.path.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return;
        }
      }
      else {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_88.fingerprint[0] = '\x01';
        local_88.fingerprint[1] = '\0';
        local_88.fingerprint[2] = '\0';
        local_88.fingerprint[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"Duplicate Key, pubkey derivation path already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      local_88.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)std::iostream_category();
      local_88.fingerprint[0] = '\x01';
      local_88.fingerprint[1] = '\0';
      local_88.fingerprint[2] = '\0';
      local_88.fingerprint[3] = '\0';
      std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"Invalid pubkey");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    local_68.vch._8_8_ = std::iostream_category();
    local_68.vch[0] = '\x01';
    local_68.vch[1] = '\0';
    local_68.vch[2] = '\0';
    local_68.vch[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)
                      "Size of key was not the expected size for the type BIP32 keypath");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypaths(Stream& s, const std::vector<unsigned char>& key, std::map<CPubKey, KeyOriginInfo>& hd_keypaths)
{
    // Make sure that the key is the size of pubkey + 1
    if (key.size() != CPubKey::SIZE + 1 && key.size() != CPubKey::COMPRESSED_SIZE + 1) {
        throw std::ios_base::failure("Size of key was not the expected size for the type BIP32 keypath");
    }
    // Read in the pubkey from key
    CPubKey pubkey(key.begin() + 1, key.end());
    if (!pubkey.IsFullyValid()) {
       throw std::ios_base::failure("Invalid pubkey");
    }
    if (hd_keypaths.count(pubkey) > 0) {
        throw std::ios_base::failure("Duplicate Key, pubkey derivation path already provided");
    }

    KeyOriginInfo keypath;
    DeserializeHDKeypath(s, keypath);

    // Add to map
    hd_keypaths.emplace(pubkey, std::move(keypath));
}